

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::DecimalQuantity::DecimalQuantity(DecimalQuantity *this,DecimalQuantity *other)

{
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__DecimalQuantity_003eda08;
  this->bogus = false;
  this->lOptPos = 0x7fffffff;
  this->lReqPos = 0;
  this->rReqPos = 0;
  this->rOptPos = -0x80000000;
  this->usingBytes = false;
  this->explicitExactDouble = false;
  operator=(this,other);
  return;
}

Assistant:

DecimalQuantity::DecimalQuantity(const DecimalQuantity &other) {
    *this = other;
}